

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode setup_range(SessionHandle *data)

{
  long lVar1;
  char *pcVar2;
  _Bool _Var3;
  
  lVar1 = (data->set).set_resume_from;
  (data->state).resume_from = lVar1;
  if ((lVar1 == 0) && ((data->set).str[0x11] == (char *)0x0)) {
    _Var3 = false;
  }
  else {
    if ((data->state).rangestringalloc == true) {
      (*Curl_cfree)((data->state).range);
    }
    if ((data->state).resume_from == 0) {
      pcVar2 = (*Curl_cstrdup)((data->set).str[0x11]);
    }
    else {
      pcVar2 = curl_maprintf("%lu-");
    }
    (data->state).range = pcVar2;
    _Var3 = true;
    (data->state).rangestringalloc = pcVar2 != (char *)0x0;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (data->state).use_range = _Var3;
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct SessionHandle *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" CURL_FORMAT_CURL_OFF_TU "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range)?TRUE:FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}